

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O2

int AF_A_PotteryChooseBit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  FState *pFVar4;
  AActor *this_00;
  char *__assertion;
  FName local_24;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053d908;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053d810:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053d908;
        }
      }
      if (numparam == 1) goto LAB_0053d890;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053d8f8;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053d908;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053d8f8;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053d890:
        pFVar4 = AActor::FindState(this_00,&local_24);
        iVar3 = FRandom::operator()(&pr_bit);
        AActor::SetState(this_00,pFVar4 + (long)((iVar3 % 5) * 2) + 1,false);
        iVar3 = FRandom::operator()(&pr_bit);
        this_00->tics = iVar3 * 2 + 0x100;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053d908;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053d810;
  }
LAB_0053d8f8:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053d908:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x60,"int AF_A_PotteryChooseBit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PotteryChooseBit)
{
	PARAM_ACTION_PROLOGUE;

	self->SetState (self->FindState(NAME_Death) + 1 + 2*(pr_bit()%5));
	self->tics = 256+(pr_bit()<<1);
	return 0;
}